

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

RealType __thiscall OpenMD::EAMAdapter::getLatticeConstant(EAMAdapter *this)

{
  EAMParameters eamParam;
  EAMParameters local_38;
  
  getEAMParam(&local_38,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.latticeType._M_dataplus._M_p != &local_38.latticeType.field_2) {
    operator_delete(local_38.latticeType._M_dataplus._M_p,
                    local_38.latticeType.field_2._M_allocated_capacity + 1);
  }
  return local_38.latticeConstant;
}

Assistant:

RealType EAMAdapter::getLatticeConstant() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeConstant;
  }